

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

Builder * capnp::compiler::anon_unknown_0::initDecl
                    (Builder *__return_storage_ptr__,Builder builder,
                    Located<capnp::Text::Reader> *name,
                    Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> *id,
                    Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
                    *genericParameters,
                    Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
                    *annotations)

{
  Builder builder_00;
  Builder builder_01;
  Orphan<capnp::compiler::LocatedInteger> *value;
  Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
  *genericParameters_00;
  size_t sVar1;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *pOVar2;
  uint local_dc;
  undefined1 local_d8 [4];
  uint i_1;
  Builder list;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  Builder local_88;
  Orphan<capnp::compiler::LocatedInteger> *local_60;
  Orphan<capnp::compiler::LocatedInteger> *i;
  Orphan<capnp::compiler::LocatedInteger> *_i343;
  CapTableBuilder *pCStack_48;
  void *local_40;
  WirePointer *pWStack_38;
  StructDataBitCount local_30;
  StructPointerCount SStack_2c;
  undefined2 uStack_2a;
  Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *local_28;
  Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *annotations_local;
  Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
  *genericParameters_local;
  Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> *id_local;
  Located<capnp::Text::Reader> *name_local;
  
  local_28 = annotations;
  annotations_local =
       (Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)
       genericParameters;
  genericParameters_local =
       (Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
        *)id;
  id_local = (Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> *)name;
  Declaration::Builder::initName((Builder *)&_i343,&builder);
  builder_00._builder.capTable = pCStack_48;
  builder_00._builder.segment = (SegmentBuilder *)_i343;
  builder_00._builder.data = local_40;
  builder_00._builder.pointers = pWStack_38;
  builder_00._builder.dataSize = local_30;
  builder_00._builder.pointerCount = SStack_2c;
  builder_00._builder._38_2_ = uStack_2a;
  Located<capnp::Text::Reader>::copyTo<capnp::compiler::LocatedText::Builder>(name,builder_00);
  i = kj::_::readMaybe<capnp::Orphan<capnp::compiler::LocatedInteger>>
                ((Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> *)genericParameters_local);
  if (i != (Orphan<capnp::compiler::LocatedInteger> *)0x0) {
    local_60 = i;
    Declaration::Builder::getId(&local_88,&builder);
    value = kj::mv<capnp::Orphan<capnp::compiler::LocatedInteger>>(local_60);
    Declaration::Id::Builder::adoptUid(&local_88,value);
  }
  memcpy(&list.builder.structDataSize,&builder,0x28);
  genericParameters_00 =
       kj::
       mv<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>>>>>>
                 ((Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
                   *)annotations_local);
  builder_01._builder.capTable = (CapTableBuilder *)uStack_a8;
  builder_01._builder.segment = (SegmentBuilder *)list.builder._32_8_;
  builder_01._builder.data = (void *)local_a0;
  builder_01._builder.pointers = (WirePointer *)uStack_98;
  builder_01._builder._32_8_ = local_90;
  initGenericParams(builder_01,genericParameters_00);
  sVar1 = kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::size
                    (local_28);
  Declaration::Builder::initAnnotations((Builder *)local_d8,&builder,(uint)sVar1);
  local_dc = 0;
  while( true ) {
    sVar1 = kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::size
                      (local_28);
    if (sVar1 <= local_dc) break;
    pOVar2 = kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
             operator[](local_28,(ulong)local_dc);
    pOVar2 = kj::mv<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>(pOVar2);
    List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Builder::
    adoptWithCaveats((Builder *)local_d8,local_dc,pOVar2);
    local_dc = local_dc + 1;
  }
  memcpy(__return_storage_ptr__,&builder,0x28);
  return __return_storage_ptr__;
}

Assistant:

static Declaration::Builder initDecl(
    Declaration::Builder builder, Located<Text::Reader>&& name,
    kj::Maybe<Orphan<LocatedInteger>>&& id,
    kj::Maybe<Located<kj::Array<kj::Maybe<Located<Text::Reader>>>>>&& genericParameters,
    kj::Array<Orphan<Declaration::AnnotationApplication>>&& annotations) {
  name.copyTo(builder.initName());
  KJ_IF_SOME(i, id) {
    builder.getId().adoptUid(kj::mv(i));
  }

  initGenericParams(builder, kj::mv(genericParameters));

  auto list = builder.initAnnotations(annotations.size());
  for (uint i = 0; i < annotations.size(); i++) {
    list.adoptWithCaveats(i, kj::mv(annotations[i]));
  }
  return builder;
}